

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O3

int __thiscall crnlib::qdxt1::init(qdxt1 *this,EVP_PKEY_CTX *ctx)

{
  vec6F_clusterizer *this_00;
  mip_desc *pmVar1;
  uint uVar2;
  dxt_pixel_block *pdVar3;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  unkuint9 Var10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  undefined1 auVar14 [11];
  undefined1 auVar15 [14];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  uint6 uVar20;
  undefined1 auVar21 [16];
  bool bVar22;
  uint uVar23;
  uint uVar24;
  crn_thread_id_t cVar25;
  int iVar26;
  void *in_RCX;
  uint *puVar27;
  ulong uVar28;
  dxt_pixel_block *in_RDX;
  ulong uVar29;
  uint e;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  float *pfVar33;
  uint uVar34;
  uint uVar35;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar36;
  int iVar37;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  uint x;
  int iVar41;
  long lVar42;
  uint uVar43;
  uint uVar44;
  undefined4 *puVar45;
  ushort uVar46;
  float fVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [15];
  undefined4 uVar55;
  undefined4 uVar56;
  double dVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  color_quad_u8 h;
  color_quad_u8 c [4];
  uint encoding_hist [8];
  color_quad_u8 layout_pixels [64];
  color_quad_u8 chunk_pixels [64];
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  selector_hash;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_5c4;
  uint local_5c0;
  float local_5bc;
  ulong local_5b8;
  uint *local_5b0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_5a8 [4];
  ulong local_598;
  ulong local_590;
  long local_588;
  ulong local_580;
  uint local_574;
  ulong local_570;
  ulong local_568;
  mip_desc *local_560;
  ulong local_558;
  ulong local_550;
  ulong local_548;
  undefined4 *local_540;
  double local_538;
  long local_530;
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_508 [64];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_408 [64];
  undefined1 local_308 [4];
  float afStack_304 [5];
  undefined8 local_2f0;
  long local_2c0 [82];
  
  clear(this);
  cVar25 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar25;
  this->m_num_blocks = (uint)ctx;
  this->m_pBlocks = in_RDX;
  memcpy(&this->m_params,in_RCX,0x630);
  this_00 = &this->m_endpoint_clusterizer;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::reserve
            (&this_00->m_training_vecs,(uint)ctx);
  this->m_progress_start = 0;
  this->m_progress_range = 0x4b;
  if (((this->m_params).m_hierarchical == true) && ((this->m_params).m_num_mips != 0)) {
    uVar31 = this->m_num_blocks;
    uVar24 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
    if (uVar24 == uVar31) {
      local_518 = (undefined1  [16])0x0;
      local_528 = (undefined1  [16])0x0;
    }
    else {
      if (uVar24 <= uVar31) {
        if ((this->m_endpoint_clusterizer).m_training_vecs.m_capacity < uVar31) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,uVar31,uVar24 + 1 == uVar31,0x1c,
                     vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::object_mover,false);
          uVar24 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
        }
        auVar21 = _DAT_001ae0a0;
        auVar53 = _DAT_001ae090;
        auVar51 = _DAT_001ae080;
        if (uVar31 - uVar24 != 0) {
          uVar28 = (ulong)(uVar31 - uVar24) * 0x1c - 0x1c >> 2;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar28;
          auVar49._8_4_ = SUB164(auVar59 * ZEXT816(0x4924924924924925),8);
          auVar49._0_8_ = SUB168(auVar59 * ZEXT816(0x4924924924924925),8);
          auVar49._12_4_ = (int)(uVar28 / 0x380000000);
          auVar50._0_8_ = uVar28 / 7;
          auVar50._8_8_ = auVar49._8_8_ >> 1;
          puVar27 = &(this_00->m_training_vecs).m_p[(ulong)uVar24 + 3].second;
          uVar32 = 0;
          auVar50 = auVar50 ^ _DAT_001ae0a0;
          do {
            auVar58._8_4_ = (int)uVar32;
            auVar58._0_8_ = uVar32;
            auVar58._12_4_ = (int)(uVar32 >> 0x20);
            auVar59 = (auVar58 | auVar53) ^ auVar21;
            iVar26 = auVar50._4_4_;
            if ((bool)(~(auVar59._4_4_ == iVar26 && auVar50._0_4_ < auVar59._0_4_ ||
                        iVar26 < auVar59._4_4_) & 1)) {
              puVar27[-0x15] = 0;
            }
            if ((auVar59._12_4_ != auVar50._12_4_ || auVar59._8_4_ <= auVar50._8_4_) &&
                auVar59._12_4_ <= auVar50._12_4_) {
              puVar27[-0xe] = 0;
            }
            auVar59 = (auVar58 | auVar51) ^ auVar21;
            iVar37 = auVar59._4_4_;
            if (iVar37 <= iVar26 && (iVar37 != iVar26 || auVar59._0_4_ <= auVar50._0_4_)) {
              puVar27[-7] = 0;
              *puVar27 = 0;
            }
            uVar32 = uVar32 + 4;
            puVar27 = puVar27 + 0x1c;
          } while ((uVar28 / 7 + 4 & 0xfffffffffffffffc) != uVar32);
        }
      }
      (this->m_endpoint_clusterizer).m_training_vecs.m_size = uVar31;
      local_518 = (undefined1  [16])0x0;
      local_528 = (undefined1  [16])0x0;
      if ((this->m_params).m_num_mips == 0) goto LAB_00141c9d;
    }
    local_518 = (undefined1  [16])0x0;
    local_528 = (undefined1  [16])0x0;
    local_5c0 = 0x200;
    uVar28 = 0;
    local_540 = &DAT_001dc524;
    uVar31 = 0;
    local_560 = (this->m_params).m_mip_desc;
    do {
      pmVar1 = local_560;
      uVar23 = local_560[uVar28].m_block_width;
      local_5b8 = (ulong)local_560[uVar28].m_block_height;
      local_5bc = 1.5;
      if (uVar28 != 0) {
        fVar47 = powf(3.1,(float)(uVar28 & 0xffffffff));
        local_5bc = 0.25;
        if (0.25 <= 1.5 / fVar47) {
          local_5bc = 1.5 / fVar47;
        }
      }
      local_558 = uVar28;
      uVar24 = (int)local_5b8 + 1;
      if (1 < uVar24) {
        pmVar1 = pmVar1 + uVar28;
        local_574 = uVar23 + 1;
        uVar28 = (ulong)((int)local_5b8 * 4 - 1);
        uVar44 = uVar23 * 4 - 1;
        local_550 = (ulong)(uVar24 >> 1);
        local_548 = (ulong)(local_574 >> 1);
        local_590 = 0;
        local_598 = 0;
        local_5b8 = uVar28;
        do {
          if (1 < local_574) {
            local_530 = local_598 * 8;
            local_580 = 0;
            lVar30 = 0;
            uVar32 = 0;
            local_568 = (ulong)(uint)((int)local_598 * 2);
            do {
              local_570 = uVar32;
              local_588 = lVar30;
              uVar23 = pmVar1->m_first_block;
              uVar2 = pmVar1->m_block_width;
              pdVar3 = this->m_pBlocks;
              paVar36 = local_408;
              lVar38 = 0;
              do {
                uVar24 = (int)local_530 + (int)lVar38;
                if ((uint)uVar28 <= uVar24) {
                  uVar24 = (uint)uVar28;
                }
                lVar42 = 0;
                do {
                  uVar43 = (int)lVar30 + (int)lVar42;
                  if (uVar44 <= uVar43) {
                    uVar43 = uVar44;
                  }
                  paVar36[lVar42] =
                       *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                        ((long)&pdVar3[(uVar43 >> 2) + (uVar24 >> 2) * uVar2 + uVar23].m_pixels[0]
                                [uVar43 & 3].field_0 + (ulong)((uVar24 & 3) << 4));
                  lVar42 = lVar42 + 1;
                } while (lVar42 != 8);
                lVar38 = lVar38 + 1;
                paVar36 = paVar36 + 8;
              } while (lVar38 != 8);
              pfVar33 = afStack_304 + 1;
              lVar30 = 0;
              do {
                uVar24 = (&DAT_001dc7b8)[lVar30 * 5];
                iVar26 = (&DAT_001dc7bc)[lVar30 * 5];
                if (iVar26 != 0) {
                  uVar43 = (&g_chunk_tile_layouts)[lVar30 * 5] + (&DAT_001dc7b4)[lVar30 * 5] * 8;
                  uVar34 = 0;
                  iVar37 = 0;
                  uVar28 = (ulong)uVar24;
                  uVar35 = uVar43;
                  uVar39 = uVar34;
                  do {
                    for (; uVar28 != 0; uVar28 = uVar28 - 1) {
                      local_508[uVar34] = local_408[uVar43];
                      uVar34 = uVar34 + 1;
                      uVar43 = uVar43 + 1;
                    }
                    iVar37 = iVar37 + 1;
                    uVar34 = uVar39 + uVar24;
                    uVar43 = uVar35 + 8;
                    uVar28 = (ulong)uVar24;
                    uVar35 = uVar43;
                    uVar39 = uVar34;
                  } while (iVar37 != iVar26);
                }
                uVar24 = iVar26 * uVar24;
                lVar38 = lVar30 * 0x50;
                dxt_fast::compress_color_block
                          (uVar24,(color_quad_u8 *)&local_508[0].field_0,
                           (uint *)(local_308 + lVar38),(uint *)(local_308 + lVar38 + 4),
                           (uint8 *)(afStack_304 + lVar30 * 0x14U + 1),false);
                dxt1_block::get_block_colors
                          ((color_quad_u8 *)&local_5a8[0].field_0,
                           (uint16)*(uint *)(local_308 + lVar38),*(uint16 *)(local_308 + lVar38 + 4)
                          );
                if (uVar24 == 0) {
                  lVar38 = 0;
                }
                else {
                  uVar28 = 0;
                  lVar38 = 0;
                  do {
                    uVar32 = (ulong)*(byte *)((long)pfVar33 + uVar28);
                    lVar38 = lVar38 + (ulong)(((uint)local_508[0].c[uVar28 * 4 + 2] -
                                              (uint)local_5a8[0].c[uVar32 * 4 + 2]) *
                                              ((uint)local_508[0].c[uVar28 * 4 + 2] -
                                              (uint)local_5a8[0].c[uVar32 * 4 + 2]) +
                                             ((uint)local_508[0].c[uVar28 * 4 + 1] -
                                             (uint)local_5a8[0].c[uVar32 * 4 + 1]) *
                                             ((uint)local_508[0].c[uVar28 * 4 + 1] -
                                             (uint)local_5a8[0].c[uVar32 * 4 + 1]) +
                                             ((uint)local_508[0].c[uVar28 * 4] -
                                             (uint)local_5a8[0].c[uVar32 * 4]) *
                                             ((uint)local_508[0].c[uVar28 * 4] -
                                             (uint)local_5a8[0].c[uVar32 * 4]));
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                local_2c0[lVar30 * 10] = lVar38;
                lVar30 = lVar30 + 1;
                pfVar33 = pfVar33 + 0x14;
              } while (lVar30 != 9);
              uVar28 = 0;
              uVar55 = 0;
              uVar56 = 0xbff00000;
              uVar32 = 0;
              puVar45 = local_540;
              do {
                dVar48 = 999999.0;
                if ((ulong)(uint)(&g_chunk_encodings)[uVar28 * 0x15] != 0) {
                  dVar57 = 0.0;
                  lVar30 = 0;
                  do {
                    lVar38 = local_2c0[(ulong)*(uint *)((long)puVar45 + lVar30) * 10];
                    auVar51._8_4_ = (int)((ulong)lVar38 >> 0x20);
                    auVar51._0_8_ = lVar38;
                    auVar51._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
                    dVar57 = dVar57 + (auVar51._8_8_ - DAT_001b3560._8_8_) +
                                      ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),
                                                        (int)lVar38) - (double)DAT_001b3560);
                    lVar30 = lVar30 + 0x14;
                  } while ((ulong)(uint)(&g_chunk_encodings)[uVar28 * 0x15] * 0x14 != lVar30);
                  dVar57 = dVar57 * 0.0052083334885537624;
                  local_5b0 = (uint *)CONCAT44(uVar56,uVar55);
                  if (dVar57 < 0.0) {
                    local_538 = dVar57;
                    dVar52 = sqrt(dVar57);
                    uVar55 = SUB84(local_5b0,0);
                    uVar56 = (undefined4)((ulong)local_5b0 >> 0x20);
                    dVar57 = local_538;
                  }
                  else {
                    dVar52 = SQRT(dVar57);
                  }
                  dVar48 = 999999.0;
                  if ((dVar57 != 0.0) || (NAN(dVar57))) {
                    dVar57 = log10(255.0 / dVar52);
                    uVar55 = SUB84(local_5b0,0);
                    uVar56 = (undefined4)((ulong)local_5b0 >> 0x20);
                    dVar57 = dVar57 * 20.0;
                    dVar48 = 500.0;
                    if (dVar57 <= 500.0) {
                      dVar48 = dVar57;
                    }
                    dVar48 = (double)(~-(ulong)(dVar57 < 0.0) & (ulong)dVar48);
                  }
                }
                dVar48 = dVar48 - (double)(((float)((&g_chunk_encodings)[uVar28 * 0x15] - 1) / 3.0)
                                           * local_5bc + 0.0);
                if ((double)CONCAT44(uVar56,uVar55) <= dVar48 &&
                    dVar48 != (double)CONCAT44(uVar56,uVar55)) {
                  uVar32 = uVar28 & 0xffffffff;
                }
                if (dVar48 <= (double)CONCAT44(uVar56,uVar55)) {
                  dVar48 = (double)CONCAT44(uVar56,uVar55);
                }
                uVar28 = uVar28 + 1;
                puVar45 = puVar45 + 0x15;
                uVar55 = SUB84(dVar48,0);
                uVar56 = (undefined4)((ulong)dVar48 >> 0x20);
              } while (uVar28 != 8);
              *(int *)(local_528 + uVar32 * 4) = *(int *)(local_528 + uVar32 * 4) + 1;
              if ((&g_chunk_encodings)[uVar32 * 0x15] != 0) {
                local_5b0 = &g_chunk_encodings + uVar32 * 0x15;
                uVar28 = 0;
                do {
                  puVar27 = &DAT_001dc514 + uVar32 * 0x15 + uVar28 * 5;
                  uVar24 = puVar27[3];
                  if (uVar24 == 0) {
                    uVar43 = puVar27[2];
                  }
                  else {
                    uVar43 = puVar27[2];
                    iVar26 = puVar27[1] << 3;
                    uVar29 = 0;
                    uVar35 = 0;
                    do {
                      iVar37 = (int)uVar29;
                      if (uVar43 != 0) {
                        uVar34 = *puVar27 + iVar26;
                        uVar40 = (ulong)uVar43;
                        do {
                          local_508[uVar29] = local_408[uVar34];
                          uVar29 = (ulong)((int)uVar29 + 1);
                          uVar34 = uVar34 + 1;
                          uVar40 = uVar40 - 1;
                        } while (uVar40 != 0);
                      }
                      uVar35 = uVar35 + 1;
                      uVar29 = (ulong)(iVar37 + uVar43);
                      iVar26 = iVar26 + 8;
                    } while (uVar35 != uVar24);
                  }
                  dxt_fast::find_representative_colors
                            (uVar43 * uVar24,(color_quad_u8 *)&local_508[0].field_0,
                             (color_quad_u8 *)&local_5a8[0].field_0,
                             (color_quad_u8 *)&local_5c4.field_0);
                  iVar26 = (local_5a8[0].m_u32 & 0xff) - (uint)local_5c4.field_0.r;
                  iVar37 = (local_5a8[0].m_u32 >> 8 & 0xff) - (uint)local_5c4.field_0.g;
                  iVar41 = (uint)(byte)local_5a8[0]._2_1_ - (uint)local_5c4.field_0.b;
                  uVar43 = iVar41 * iVar41 + iVar26 * iVar26 + iVar37 * iVar37;
                  uVar24 = (uint)((ulong)uVar43 * 0x68db8bad >> 0x2b);
                  if (7 < uVar24) {
                    uVar24 = 8;
                  }
                  if (uVar43 < 5000) {
                    uVar24 = 1;
                  }
                  uVar29 = (ulong)puVar27[3];
                  if (3 < puVar27[3]) {
                    auVar54 = ZEXT115(local_5c4.field_0.r) << 0x18 |
                              (~DAT_001b3570._0_15_ & ZEXT115((byte)local_5a8[0]._2_1_) << 0x10 |
                              ZEXT415(local_5a8[0].m_u32) & DAT_001b3570._0_15_) &
                              DAT_001b3580._0_15_;
                    Var10 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar54[3]);
                    auVar18._9_6_ = 0;
                    auVar18._0_9_ = Var10;
                    auVar14._1_10_ = SUB1510(auVar18 << 0x30,5);
                    auVar14[0] = auVar54[2];
                    auVar19._11_4_ = 0;
                    auVar19._0_11_ = auVar14;
                    auVar8[2] = auVar54[1];
                    auVar8._0_2_ = auVar54._0_2_;
                    auVar8._3_12_ = SUB1512(auVar19 << 0x20,3);
                    auVar9._2_13_ = auVar8._2_13_;
                    auVar9._0_2_ = auVar54._0_2_ & 0xff;
                    auVar5._10_2_ = 0;
                    auVar5._0_10_ = auVar9._0_10_;
                    auVar5._12_2_ = (short)Var10;
                    uVar20 = CONCAT42(auVar5._10_4_,auVar14._0_2_);
                    auVar15._6_8_ = 0;
                    auVar15._0_6_ = uVar20;
                    auVar7._4_2_ = auVar8._2_2_;
                    auVar7._0_4_ = auVar9._0_4_;
                    auVar7._6_8_ = SUB148(auVar15 << 0x40,6);
                    auVar53._0_4_ = (float)(auVar9._0_4_ & 0xffff);
                    auVar53._4_4_ = (float)auVar7._4_4_;
                    auVar53._8_4_ = (float)(int)uVar20;
                    auVar53._12_4_ = (float)(auVar5._10_4_ >> 0x10);
                    uVar43 = 0;
                    uVar40 = local_590;
                    do {
                      uVar35 = puVar27[1];
                      if ((uVar43 + (int)local_568 + (uVar35 >> 2) < pmVar1->m_block_height) &&
                         (3 < puVar27[2])) {
                        uVar34 = 0;
                        do {
                          iVar26 = (int)local_580 + uVar34;
                          if (pmVar1->m_block_width <= iVar26 + (*puVar27 >> 2)) break;
                          uVar39 = iVar26 + pmVar1->m_block_width * ((uVar35 >> 2) + (int)uVar40) +
                                            (*puVar27 >> 2) + pmVar1->m_first_block;
                          ppVar4 = (this_00->m_training_vecs).m_p;
                          *(undefined1 (*) [16])ppVar4[uVar39].first.m_s = auVar53;
                          ppVar4[uVar39].first.m_s[4] = (float)local_5c4._1_1_;
                          ppVar4[uVar39].first.m_s[5] = (float)local_5c4._2_1_;
                          (this_00->m_training_vecs).m_p[uVar39].second = uVar24;
                          uVar34 = uVar34 + 1;
                        } while (uVar34 < puVar27[2] >> 2);
                        uVar31 = uVar31 + uVar34;
                        uVar29 = (ulong)puVar27[3];
                      }
                      uVar43 = uVar43 + 1;
                      uVar40 = (ulong)((int)uVar40 + 1);
                    } while (uVar43 < (uint)(uVar29 >> 2));
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 < *local_5b0);
              }
              if (local_5c0 <= uVar31) {
                bVar22 = update_progress(this,uVar31,this->m_num_blocks - 1);
                if (!bVar22) {
                  return 0;
                }
                local_5c0 = local_5c0 + 0x200;
              }
              uVar32 = local_570 + 1;
              lVar30 = local_588 + 8;
              local_580 = (ulong)((int)local_580 + 2);
              uVar28 = local_5b8;
            } while (uVar32 != local_548);
          }
          local_598 = local_598 + 1;
          local_590 = (ulong)((int)local_590 + 2);
        } while (local_598 != local_550);
      }
      uVar28 = local_558 + 1;
    } while (uVar28 < (this->m_params).m_num_mips);
  }
  else {
    uVar28 = (ulong)this->m_num_blocks;
    if (this->m_num_blocks != 0) {
      lVar30 = 0;
      uVar32 = 0;
      do {
        if (((uVar32 & 0x1ff) == 0) &&
           (bVar22 = update_progress(this,(uint)uVar32,(int)uVar28 - 1), !bVar22)) {
          return 0;
        }
        dxt_fast::find_representative_colors
                  (0x10,(color_quad_u8 *)((long)&this->m_pBlocks->m_pixels[0][0].field_0 + lVar30),
                   (color_quad_u8 *)&local_408[0].field_0,(color_quad_u8 *)&local_508[0].field_0);
        iVar26 = (local_408[0].m_u32 & 0xff) - (uint)(byte)local_508[0]._0_1_;
        iVar41 = (local_408[0].m_u32 >> 8 & 0xff) - (uint)(byte)local_508[0]._1_1_;
        iVar37 = (uint)(byte)local_408[0]._2_1_ - (uint)(byte)local_508[0]._2_1_;
        uVar24 = iVar37 * iVar37 + iVar26 * iVar26 + iVar41 * iVar41;
        uVar31 = (uint)((ulong)uVar24 * 0x68db8bad >> 0x20);
        uVar23 = uVar31 >> 0xb;
        if (7 < uVar31 >> 0xb) {
          uVar23 = 8;
        }
        if (uVar24 < 5000) {
          uVar23 = 1;
        }
        auVar54 = ZEXT115((byte)local_508[0]._0_1_) << 0x18 |
                  (~DAT_001b3570._0_15_ & ZEXT115((byte)local_408[0]._2_1_) << 0x10 |
                  ZEXT415(local_408[0].m_u32) & DAT_001b3570._0_15_) & DAT_001b3580._0_15_;
        Var10 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar54[3]);
        auVar16._9_6_ = 0;
        auVar16._0_9_ = Var10;
        auVar11._1_10_ = SUB1510(auVar16 << 0x30,5);
        auVar11[0] = auVar54[2];
        auVar17._11_4_ = 0;
        auVar17._0_11_ = auVar11;
        auVar12._1_12_ = SUB1512(auVar17 << 0x20,3);
        auVar12[0] = auVar54[1];
        uVar46 = CONCAT11(0,auVar54[0]);
        auVar54._2_13_ = auVar12;
        auVar54._0_2_ = uVar46;
        auVar6._10_2_ = 0;
        auVar6._0_10_ = auVar54._0_10_;
        auVar6._12_2_ = (short)Var10;
        uVar20 = CONCAT42(auVar6._10_4_,auVar11._0_2_);
        auVar13._6_8_ = 0;
        auVar13._0_6_ = uVar20;
        _local_308 = (raw_node *)
                     CONCAT44((float)(int)CONCAT82(SUB148(auVar13 << 0x40,6),auVar12._0_2_),
                              (float)uVar46);
        afStack_304[2] = (float)(auVar6._10_4_ >> 0x10);
        afStack_304[1] = (float)(int)uVar20;
        afStack_304[3] = (float)(byte)local_508[0]._1_1_;
        afStack_304[4] = (float)(byte)local_508[0]._2_1_;
        clusterizer<crnlib::vec<6U,_float>_>::add_training_vec
                  (this_00,(vec<6U,_float> *)local_308,uVar23);
        uVar32 = uVar32 + 1;
        uVar28 = (ulong)this->m_num_blocks;
        lVar30 = lVar30 + 0x40;
      } while (uVar32 < uVar28);
    }
  }
LAB_00141c9d:
  this->m_progress_start = 0x4b;
  this->m_progress_range = 0x14;
  lVar30 = 0;
  iVar26 = 0;
  bVar22 = clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
                     (this_00,0xffff,generate_codebook_progress_callback,this,false);
  if (bVar22) {
    _local_308 = (raw_node *)0x0;
    afStack_304[1] = 0.0;
    afStack_304[2] = 0.0;
    afStack_304[3] = 4.48416e-44;
    local_2f0._0_4_ = 0;
    local_2f0._4_4_ = 0;
    this->m_progress_start = 0x5f;
    this->m_progress_range = 5;
    uVar28 = (ulong)this->m_num_blocks;
    if (this->m_num_blocks == 0) {
      uVar23 = 0x80;
    }
    else {
      lVar30 = 0;
      uVar32 = 0;
      do {
        if (((uVar32 & 0x1ff) == 0) &&
           (bVar22 = update_progress(this,(uint)uVar32,(int)uVar28 - 1), !bVar22)) {
          iVar26 = 0;
          goto LAB_00142717;
        }
        dxt_fast::compress_color_block
                  ((dxt1_block *)&local_508[0].field_0,
                   (color_quad_u8 *)((long)&this->m_pBlocks->m_pixels[0][0].field_0 + lVar30),false)
        ;
        local_528._0_4_ = local_508[1];
        hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::insert((insert_result *)&local_408[0].field_0,
                 (hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                  *)local_308,(uint *)local_528,(empty_type *)&local_5a8[0].field_0);
        uVar32 = uVar32 + 1;
        uVar28 = (ulong)this->m_num_blocks;
        lVar30 = lVar30 + 0x40;
      } while (uVar32 < uVar28);
      uVar23 = (uint)local_2f0 + 0x80;
    }
    this->m_max_selector_clusters = uVar23;
    iVar26 = (int)CONCAT71((int7)((ulong)lVar30 >> 8),1);
    update_progress(this,1,1);
LAB_00142717:
    if (afStack_304[1] == 0.0) {
      if (_local_308 != (raw_node *)0x0) {
        crnlib_free(_local_308);
      }
    }
    else if (_local_308 != (raw_node *)0x0) {
      crnlib_free(_local_308);
    }
  }
  return iVar26;
}

Assistant:

bool qdxt1::init(uint n, const dxt_pixel_block* pBlocks, const qdxt1_params& params) {
  clear();

  CRNLIB_ASSERT(n && pBlocks);

  m_main_thread_id = crn_get_current_thread_id();

  m_num_blocks = n;
  m_pBlocks = pBlocks;
  m_params = params;

  m_endpoint_clusterizer.reserve_training_vecs(m_num_blocks);

  m_progress_start = 0;
  m_progress_range = 75;

  const bool debugging = false;
  image_u8 debug_img;

  if ((m_params.m_hierarchical) && (m_params.m_num_mips)) {
    vec6F_clusterizer::training_vec_array& training_vecs = m_endpoint_clusterizer.get_training_vecs();
    training_vecs.resize(m_num_blocks);

    uint encoding_hist[cNumChunkEncodings];
    utils::zero_object(encoding_hist);

    uint total_processed_blocks = 0;
    uint next_progress_threshold = 512;

    for (uint level = 0; level < m_params.m_num_mips; level++) {
      const qdxt1_params::mip_desc& level_desc = m_params.m_mip_desc[level];

      const uint num_chunks_x = (level_desc.m_block_width + cChunkBlockWidth - 1) / cChunkBlockWidth;
      const uint num_chunks_y = (level_desc.m_block_height + cChunkBlockHeight - 1) / cChunkBlockHeight;

      const uint level_width = level_desc.m_block_width * 4;
      const uint level_height = level_desc.m_block_height * 4;

      if (debugging)
        debug_img.resize(num_chunks_x * cChunkPixelWidth, num_chunks_y * cChunkPixelHeight);

      float adaptive_tile_color_psnr_derating = 1.5f;  // was 2.4f
      if ((level) && (adaptive_tile_color_psnr_derating > .25f)) {
        adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.1f, static_cast<float>(level)));  // was 3.0f
      }
      for (uint chunk_y = 0; chunk_y < num_chunks_y; chunk_y++) {
        for (uint chunk_x = 0; chunk_x < num_chunks_x; chunk_x++) {
          color_quad_u8 chunk_pixels[cChunkPixelWidth * cChunkPixelHeight];

          for (uint y = 0; y < cChunkPixelHeight; y++) {
            const uint pix_y = math::minimum<uint>(chunk_y * cChunkPixelHeight + y, level_height - 1);

            const uint outer_block_index = level_desc.m_first_block + ((pix_y >> 2) * level_desc.m_block_width);

            for (uint x = 0; x < cChunkPixelWidth; x++) {
              const uint pix_x = math::minimum<uint>(chunk_x * cChunkPixelWidth + x, level_width - 1);

              const uint block_index = outer_block_index + (pix_x >> 2);

              const dxt_pixel_block& block = m_pBlocks[block_index];

              const color_quad_u8& p = block.m_pixels[pix_y & 3][pix_x & 3];

              chunk_pixels[x + y * 8] = p;
            }
          }

          struct layout_results {
            uint m_low_color;
            uint m_high_color;
            uint8 m_selectors[cChunkPixelWidth * cChunkPixelHeight];
            uint64 m_error;
            //float m_penalty;
          };
          layout_results layouts[cNumChunkTileLayouts];

          for (uint l = 0; l < cNumChunkTileLayouts; l++) {
            const uint width = g_chunk_tile_layouts[l].m_width;
            const uint height = g_chunk_tile_layouts[l].m_height;
            const uint x_ofs = g_chunk_tile_layouts[l].m_x_ofs;
            const uint y_ofs = g_chunk_tile_layouts[l].m_y_ofs;

            color_quad_u8 layout_pixels[cChunkPixelWidth * cChunkPixelHeight];
            for (uint y = 0; y < height; y++)
              for (uint x = 0; x < width; x++)
                layout_pixels[x + y * width] = chunk_pixels[(x_ofs + x) + (y_ofs + y) * cChunkPixelWidth];

            const uint n = width * height;
            dxt_fast::compress_color_block(n, layout_pixels, layouts[l].m_low_color, layouts[l].m_high_color, layouts[l].m_selectors);

            color_quad_u8 c[4];
            dxt1_block::get_block_colors(c, static_cast<uint16>(layouts[l].m_low_color), static_cast<uint16>(layouts[l].m_high_color));

            uint64 error = 0;
            for (uint i = 0; i < n; i++)
              error += color::elucidian_distance(layout_pixels[i], c[layouts[l].m_selectors[i]], false);

            layouts[l].m_error = error;

#if 0
                     if ((width > 4) || (height > 4))
                     {
                        const uint dist = color::elucidian_distance(
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_low_color), true),
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_high_color), true), false);

                        layouts[l].m_penalty = math::clamp((sqrt((float)dist) - 75.0f) / 150.0f, 0.0f, 2.0f);
                        if ((width == 8) && (height == 8))
                           layouts[l].m_penalty *= 2.0f;
                     }
                     else
                     {
                        layouts[l].m_penalty = 0.0f;
                     }
#endif
          }

          double best_peak_snr = -1.0f;
          uint best_encoding = 0;

          for (uint e = 0; e < cNumChunkEncodings; e++) {
            const chunk_encoding_desc& encoding_desc = g_chunk_encodings[e];

            double total_error = 0;

            for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
              total_error += (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_error;

            //double mean_squared = total_error * (1.0f / (16.0f * 3.0f));
            double mean_squared = total_error * (1.0f / (64.0f * 3.0f));
            double root_mean_squared = sqrt(mean_squared);

            double peak_snr = 999999.0f;
            if (mean_squared)
              peak_snr = math::clamp<double>(log10(255.0f / root_mean_squared) * 20.0f, 0.0f, 500.0f);

            //if (level)
            //   adaptive_tile_color_psnr_derating = math::lerp(adaptive_tile_color_psnr_derating * .5f, .3f, math::maximum((level - 1) / float(m_params.m_num_mips - 2), 1.0f));

            float color_derating = math::lerp(0.0f, adaptive_tile_color_psnr_derating, (g_chunk_encodings[e].m_num_tiles - 1) / 3.0f);
            peak_snr = peak_snr - color_derating;

            //for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
            //   peak_snr -= (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_penalty;

            if (peak_snr > best_peak_snr) {
              best_peak_snr = peak_snr;
              best_encoding = e;
            }
          }

          encoding_hist[best_encoding]++;

          const chunk_encoding_desc& encoding_desc = g_chunk_encodings[best_encoding];

          for (uint t = 0; t < encoding_desc.m_num_tiles; t++) {
            const chunk_tile_desc& tile_desc = encoding_desc.m_tiles[t];

            uint layout_index = tile_desc.m_layout_index;
            const layout_results& layout = layouts[layout_index];
            color_quad_u8 c[4];
            if (debugging)
              dxt1_block::get_block_colors(c, static_cast<uint16>(layout.m_low_color), static_cast<uint16>(layout.m_high_color));

            color_quad_u8 tile_pixels[cChunkPixelWidth * cChunkPixelHeight];

            for (uint y = 0; y < tile_desc.m_height; y++) {
              const uint pix_y = y + tile_desc.m_y_ofs;

              for (uint x = 0; x < tile_desc.m_width; x++) {
                const uint pix_x = x + tile_desc.m_x_ofs;

                tile_pixels[x + y * tile_desc.m_width] = chunk_pixels[pix_x + pix_y * cChunkPixelWidth];

                if (debugging)
                  debug_img(chunk_x * 8 + pix_x, chunk_y * 8 + pix_y) = c[layout.m_selectors[x + y * tile_desc.m_width]];
              }
            }

            color_quad_u8 l, h;
            dxt_fast::find_representative_colors(tile_desc.m_width * tile_desc.m_height, tile_pixels, l, h);

            //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
            const uint dist = color::elucidian_distance(l, h, false);

            const uint cColorDistToWeight = 5000;
            const uint cMaxWeight = 8;
            uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

            vec6F ev;

            ev[0] = l[0];
            ev[1] = l[1];
            ev[2] = l[2];
            ev[3] = h[0];
            ev[4] = h[1];
            ev[5] = h[2];

            for (uint y = 0; y < (tile_desc.m_height >> 2); y++) {
              uint block_y = chunk_y * cChunkBlockHeight + y + (tile_desc.m_y_ofs >> 2);
              if (block_y >= level_desc.m_block_height)
                continue;

              for (uint x = 0; x < (tile_desc.m_width >> 2); x++) {
                uint block_x = chunk_x * cChunkBlockWidth + x + (tile_desc.m_x_ofs >> 2);
                if (block_x >= level_desc.m_block_width)
                  break;

                uint block_index = level_desc.m_first_block + block_x + block_y * level_desc.m_block_width;

                training_vecs[block_index].first = ev;
                training_vecs[block_index].second = weight;

                total_processed_blocks++;

                //if (debugging)
                //{
                //   debug_img(block_x, block_y) = l;
                //   debug_img(block_x + level_desc.m_block_width, block_y) = h;
                //}

              }  // x
            }    // y
          }      //t

          if (total_processed_blocks >= next_progress_threshold) {
            next_progress_threshold += 512;

            if (!update_progress(total_processed_blocks, m_num_blocks - 1))
              return false;
          }

        }  // chunk_x
      }    // chunk_y

#if GENERATE_DEBUG_IMAGES
      if (debugging)
        image_utils::write_to_file(dynamic_string(cVarArg, "debug_%u.tga", level).get_ptr(), debug_img, image_utils::cWriteFlagIgnoreAlpha);
#endif

    }  // level

#if 0
         trace("chunk encoding hist: ");
         for (uint i = 0; i < cNumChunkEncodings; i++)
            trace("%u ", encoding_hist[i]);
         trace("\n");
#endif
  } else {
    for (uint block_index = 0; block_index < m_num_blocks; block_index++) {
      if ((block_index & 511) == 0) {
        if (!update_progress(block_index, m_num_blocks - 1))
          return false;
      }

      color_quad_u8 l, h;
      dxt_fast::find_representative_colors(cDXTBlockSize * cDXTBlockSize, &m_pBlocks[block_index].m_pixels[0][0], l, h);

      //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
      const uint dist = color::elucidian_distance(l, h, false);

      const uint cColorDistToWeight = 5000;
      const uint cMaxWeight = 8;
      uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

      vec6F ev;

      ev[0] = l[0];
      ev[1] = l[1];
      ev[2] = l[2];
      ev[3] = h[0];
      ev[4] = h[1];
      ev[5] = h[2];

      m_endpoint_clusterizer.add_training_vec(ev, weight);
    }
  }

  const uint cMaxEndpointClusters = 65535U;

  m_progress_start = 75;
  m_progress_range = 20;

  if (!m_endpoint_clusterizer.generate_codebook(cMaxEndpointClusters, generate_codebook_progress_callback, this))
    return false;

  crnlib::hash_map<uint, empty_type> selector_hash;

  m_progress_start = 95;
  m_progress_range = 5;

  for (uint block_index = 0; block_index < m_num_blocks; block_index++) {
    if ((block_index & 511) == 0) {
      if (!update_progress(block_index, m_num_blocks - 1))
        return false;
    }

    dxt1_block dxt_blk;
    dxt_fast::compress_color_block(&dxt_blk, &m_pBlocks[block_index].m_pixels[0][0]);

    uint selectors = dxt_blk.m_selectors[0] | (dxt_blk.m_selectors[1] << 8) | (dxt_blk.m_selectors[2] << 16) | (dxt_blk.m_selectors[3] << 24);

    selector_hash.insert(selectors);
  }

  m_max_selector_clusters = selector_hash.size() + 128;

  //      trace("max endpoint clusters: %u\n", m_endpoint_clusterizer.get_codebook_size());
  //      trace("max selector clusters: %u\n", m_max_selector_clusters);

  update_progress(1, 1);

  return true;
}